

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  bool bVar1;
  reference ppvVar2;
  iterator ppvVar3;
  void **ppvVar4;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this_local;
  
  DeallocateCustomSizedSlabs(this);
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_>::clear
            (&(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)&this->Slabs);
  if (!bVar1) {
    this->BytesAllocated = 0;
    ppvVar2 = SmallVectorTemplateCommon<void_*,_void>::front
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    this->CurPtr = (char *)*ppvVar2;
    this->End = this->CurPtr + 0x1000;
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::begin
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    ppvVar4 = std::next<void**>(ppvVar3,1);
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::end
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    DeallocateSlabs(this,ppvVar4,ppvVar3);
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::begin
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    ppvVar4 = std::next<void**>(ppvVar3,1);
    ppvVar3 = SmallVectorTemplateCommon<void_*,_void>::end
                        ((SmallVectorTemplateCommon<void_*,_void> *)&this->Slabs);
    SmallVectorImpl<void_*>::erase(&(this->Slabs).super_SmallVectorImpl<void_*>,ppvVar4,ppvVar3);
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }